

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::printLine<long,long,long>(char *text,long *args,long *args_1,long *args_2)

{
  long *in_R9;
  string_view text_00;
  undefined1 auVar1 [16];
  undefined1 local_48 [8];
  string message;
  long *args_local_2;
  long *args_local_1;
  long *args_local;
  char *text_local;
  
  message.field_2._8_8_ = args_2;
  tinyformat::format<long,long,long>
            ((string *)local_48,(tinyformat *)text,(char *)args,args_1,args_2,in_R9);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
  text_00._M_str = auVar1._8_8_;
  text_00._M_len = (size_t)text_00._M_str;
  printLine(auVar1._0_8_,text_00);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}